

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::readString(File *this,string *value)

{
  bool bVar1;
  void *__ptr;
  size_t sVar2;
  ulong in_RSI;
  long in_RDI;
  unsigned_long len;
  unsigned_long *in_stack_00000030;
  File *in_stack_00000038;
  undefined8 local_20;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_1 = false;
  }
  else {
    bVar1 = readULong(in_stack_00000038,in_stack_00000030);
    if (bVar1) {
      std::__cxx11::string::resize(in_RSI);
      __ptr = (void *)std::__cxx11::string::operator[](in_RSI);
      sVar2 = fread(__ptr,1,local_20,*(FILE **)(in_RDI + 0x30));
      if (sVar2 == local_20) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool File::readString(std::string& value)
{
	if (!valid) return false;

	// Retrieve the length to read from the file
	unsigned long len;

	if (!readULong(len))
	{
		return false;
	}

	// Read the string from the file
	value.resize(len);

	if (fread(&value[0], 1, len, stream) != len)
	{
		return false;
	}

	return true;
}